

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O1

int __thiscall qclab::qgates::CZ<float>::toQASM(CZ<float> *this,ostream *stream,int offset)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_R8D;
  __string_type local_48;
  
  if ((this->super_QControlledGate2<float>).controlState_ == 0) {
    qasm1_abi_cxx11_(&local_48,(qclab *)0x1244b7,
                     (char *)(ulong)(uint)((this->super_QControlledGate2<float>).control_ + offset),
                     in_ECX);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (this->super_QControlledGate2<float>).control_;
  iVar2 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
            _vptr_QObject[0xf])(this);
  iVar2 = iVar2 + offset;
  qasm2_abi_cxx11_(&local_48,(qclab *)"cz",(char *)(ulong)(uint)(iVar1 + offset),iVar2,in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_QControlledGate2<float>).controlState_ == 0) {
    qasm1_abi_cxx11_(&local_48,(qclab *)0x1244b7,
                     (char *)(ulong)(uint)(offset + (this->super_QControlledGate2<float>).control_),
                     iVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          stream << qasmCZ( this->control() + offset ,
                            this->target()  + offset ) ;
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          return 0 ;
        }